

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selection_widgets.cpp
# Opt level: O3

void calculate_group_size
               (Am_Value_List *list,int *min_left,int *min_top,int *max_right,int *max_bottom,
               Am_Object *owner)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Am_Value *pAVar7;
  Am_Object cur_owner;
  Am_Object obj;
  Am_Object local_78;
  int *local_70;
  int *local_68;
  int *local_60;
  Am_Object *local_58;
  int *local_50;
  Am_Object local_48;
  Am_Object local_40;
  Am_Object local_38;
  
  *min_left = 29999;
  *min_top = 29999;
  *max_right = -29999;
  *max_bottom = -29999;
  local_48.data = (Am_Object_Data *)0x0;
  local_78.data = (Am_Object_Data *)0x0;
  local_70 = max_right;
  local_68 = min_left;
  local_60 = min_top;
  local_58 = owner;
  local_50 = max_bottom;
  Am_Value_List::Start(list);
  do {
    bVar1 = Am_Value_List::Last(list);
    if (bVar1) {
      Am_Object::~Am_Object(&local_78);
      Am_Object::~Am_Object(&local_48);
      return;
    }
    pAVar7 = Am_Value_List::Get(list);
    Am_Object::operator=(&local_48,pAVar7);
    Am_Object::Get_Object(&local_38,(Am_Slot_Key)&local_48,10);
    Am_Object::operator=(&local_78,&local_38);
    Am_Object::~Am_Object(&local_38);
    bVar1 = Am_Object::Valid(&local_78);
    if (bVar1) {
      bVar1 = Am_Object::Valid(local_58);
      if (bVar1) {
        bVar1 = Am_Object::operator!=(local_58,&local_78);
        if (bVar1) {
          Am_Error("Moving objects from different groups.");
        }
      }
      else {
        Am_Object::operator=(local_58,&local_78);
      }
    }
    Am_Object::Am_Object(&local_40,&Am_Line);
    bVar1 = Am_Object::Is_Instance_Of(&local_48,&local_40);
    Am_Object::~Am_Object(&local_40);
    if (bVar1) {
      pAVar7 = Am_Object::Get(&local_48,0x8b,0);
      iVar2 = Am_Value::operator_cast_to_int(pAVar7);
      pAVar7 = Am_Object::Get(&local_48,0x8d,0);
      iVar3 = Am_Value::operator_cast_to_int(pAVar7);
      pAVar7 = Am_Object::Get(&local_48,0x8c,0);
      iVar4 = Am_Value::operator_cast_to_int(pAVar7);
      pAVar7 = Am_Object::Get(&local_48,0x8e,0);
      iVar5 = Am_Value::operator_cast_to_int(pAVar7);
      iVar6 = *local_68;
      if (iVar2 <= *local_68) {
        iVar6 = iVar2;
      }
      if (iVar3 <= iVar6) {
        iVar6 = iVar3;
      }
      *local_68 = iVar6;
      iVar6 = *local_60;
      if (iVar4 <= *local_60) {
        iVar6 = iVar4;
      }
      if (iVar5 <= iVar6) {
        iVar6 = iVar5;
      }
      *local_60 = iVar6;
      iVar6 = *local_70;
      if (*local_70 <= iVar2) {
        iVar6 = iVar2;
      }
      if (iVar3 < iVar6) {
        iVar3 = iVar6;
      }
      *local_70 = iVar3;
      iVar3 = *local_50;
      if (*local_50 <= iVar4) {
        iVar3 = iVar4;
      }
      if (iVar5 < iVar3) {
        iVar5 = iVar3;
      }
    }
    else {
      pAVar7 = Am_Object::Get(&local_48,100,0);
      iVar3 = Am_Value::operator_cast_to_int(pAVar7);
      pAVar7 = Am_Object::Get(&local_48,0x65,0);
      iVar6 = Am_Value::operator_cast_to_int(pAVar7);
      iVar5 = *local_68;
      if (iVar3 <= *local_68) {
        iVar5 = iVar3;
      }
      *local_68 = iVar5;
      iVar5 = *local_60;
      if (iVar6 <= *local_60) {
        iVar5 = iVar6;
      }
      *local_60 = iVar5;
      iVar5 = *local_70;
      pAVar7 = Am_Object::Get(&local_48,0x66,0);
      iVar2 = Am_Value::operator_cast_to_int(pAVar7);
      if (iVar5 <= iVar2 + iVar3) {
        iVar5 = iVar2 + iVar3;
      }
      *local_70 = iVar5;
      iVar5 = *local_50;
      pAVar7 = Am_Object::Get(&local_48,0x67,0);
      iVar3 = Am_Value::operator_cast_to_int(pAVar7);
      if (iVar5 <= iVar3 + iVar6) {
        iVar5 = iVar3 + iVar6;
      }
    }
    *local_50 = iVar5;
    Am_Value_List::Next(list);
  } while( true );
}

Assistant:

void
calculate_group_size(Am_Value_List list, int &min_left, int &min_top,
                     int &max_right, int &max_bottom, Am_Object &owner)
{
  min_left = 29999;
  min_top = 29999;
  max_right = -29999;
  max_bottom = -29999;
  int cur_left, cur_top;
  Am_Object obj, cur_owner;
  for (list.Start(); !list.Last(); list.Next()) {
    obj = list.Get();
    cur_owner = obj.Get_Owner();
    if (cur_owner.Valid()) {
      if (!owner.Valid())
        owner = cur_owner;
      else if (owner != cur_owner)
        Am_Error("Moving objects from different groups.");
    }
    if (obj.Is_Instance_Of(Am_Line)) {
      int x1, x2, y1, y2;
      x1 = obj.Get(Am_X1);
      x2 = obj.Get(Am_X2);
      y1 = obj.Get(Am_Y1);
      y2 = obj.Get(Am_Y2);
      min_left = IMIN(IMIN(min_left, x1), x2);
      min_top = IMIN(IMIN(min_top, y1), y2);
      max_right = IMAX(IMAX(max_right, x1), x2);
      max_bottom = IMAX(IMAX(max_bottom, y1), y2);
    } else {
      cur_left = obj.Get(Am_LEFT);
      cur_top = obj.Get(Am_TOP);
      min_left = IMIN(min_left, cur_left);
      min_top = IMIN(min_top, cur_top);
      max_right = IMAX(max_right, cur_left + (int)obj.Get(Am_WIDTH));
      max_bottom = IMAX(max_bottom, cur_top + (int)obj.Get(Am_HEIGHT));
    }
  }
}